

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_lc.c
# Opt level: O3

double * MatSub(double *A,double *B,int row,int col)

{
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  double *pdVar4;
  ulong uVar5;
  
  pdVar1 = (double *)malloc((long)col * (long)row * 8);
  if (0 < row) {
    uVar2 = (ulong)(uint)col;
    uVar3 = 0;
    pdVar4 = pdVar1;
    do {
      if (0 < col) {
        uVar5 = 0;
        do {
          pdVar4[uVar5] = A[uVar5] - B[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar2 != uVar5);
      }
      uVar3 = uVar3 + 1;
      pdVar4 = pdVar4 + uVar2;
      B = B + uVar2;
      A = A + uVar2;
    } while (uVar3 != (uint)row);
  }
  return pdVar1;
}

Assistant:

double *MatSub(double *A, double *B, int row, int col) {
    double *Out = (double *) malloc(sizeof(double) * row * col);
    for (int i = 0; i < row; i++)
        for (int j = 0; j < col; j++)
            Out[col * i + j] = A[col * i + j] - B[col * i + j];
    return Out;
}